

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O3

void __thiscall interface::parse_communication_parameters(interface *this,string *parameters)

{
  int iVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  parity pVar6;
  stop_bits sVar7;
  int iVar8;
  undefined8 *puVar9;
  ulong uVar10;
  invalid_argument *this_00;
  long *plVar11;
  long lVar12;
  size_type *psVar13;
  long unaff_R13;
  string *psVar14;
  smatch match;
  out_of_range ex;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (parse_communication_parameters(std::__cxx11::string_const&)::baud_rate_abi_cxx11_ == '\0') {
    iVar8 = __cxa_guard_acquire(&parse_communication_parameters(std::__cxx11::string_const&)::
                                 baud_rate_abi_cxx11_);
    if (iVar8 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&parse_communication_parameters(std::__cxx11::string_const&)::baud_rate_abi_cxx11_,
                 "^(\\d+)",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parse_communication_parameters(std::__cxx11::string_const&)::
                    baud_rate_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parse_communication_parameters(std::__cxx11::string_const&)::
                           baud_rate_abi_cxx11_);
    }
  }
  if (parse_communication_parameters(std::__cxx11::string_const&)::baud_rate_and_params_abi_cxx11_
      == '\0') {
    iVar8 = __cxa_guard_acquire(&parse_communication_parameters(std::__cxx11::string_const&)::
                                 baud_rate_and_params_abi_cxx11_);
    if (iVar8 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&parse_communication_parameters(std::__cxx11::string_const&)::
                  baud_rate_and_params_abi_cxx11_,"^(\\d+)\\,([78])([noeNOE])(1\\.5|1|2)",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parse_communication_parameters(std::__cxx11::string_const&)::
                    baud_rate_and_params_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parse_communication_parameters(std::__cxx11::string_const&)::
                           baud_rate_and_params_abi_cxx11_);
    }
  }
  if (parse_communication_parameters(std::__cxx11::string_const&)::params_only_abi_cxx11_ == '\0') {
    iVar8 = __cxa_guard_acquire(&parse_communication_parameters(std::__cxx11::string_const&)::
                                 params_only_abi_cxx11_);
    if (iVar8 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&parse_communication_parameters(std::__cxx11::string_const&)::
                  params_only_abi_cxx11_,"([78])([noeNOE])(1\\.5|1|2))",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parse_communication_parameters(std::__cxx11::string_const&)::
                    params_only_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parse_communication_parameters(std::__cxx11::string_const&)::
                           params_only_abi_cxx11_);
    }
  }
  local_68 = 0;
  uStack_60 = 0;
  local_78._M_allocated_capacity = 0;
  local_78._8_8_ = 0;
  _Var2._M_current = (parameters->_M_dataplus)._M_p;
  bVar4 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(_Var2._M_current + parameters->_M_string_length),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&local_78,
                     &parse_communication_parameters(std::__cxx11::string_const&)::
                      baud_rate_abi_cxx11_,0);
  if (bVar4) {
    lVar12 = local_78._8_8_ - local_78._0_8_;
    if ((lVar12 == 0) || (0xfffffffffffffffd < (lVar12 >> 3) * -0x5555555555555555 - 5U)) {
      puVar9 = (undefined8 *)(local_78._M_allocated_capacity + lVar12 + -0x48);
    }
    else {
      puVar9 = (undefined8 *)(local_78._M_allocated_capacity + 0x18);
    }
    if (*(char *)(puVar9 + 2) == '\x01') {
      local_98._0_8_ = local_98 + 0x10;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_98,*puVar9,puVar9[1]);
    }
    else {
      local_98._0_8_ = local_98 + 0x10;
      local_98._8_8_ = 0;
      local_98._16_8_ = local_98._16_8_ & 0xffffffffffffff00;
    }
    uVar3 = local_98._0_8_;
    parameters = (string *)__errno_location();
    iVar8 = *(int *)&(parameters->_M_dataplus)._M_p;
    *(int *)&(parameters->_M_dataplus)._M_p = 0;
    uVar10 = strtoul((char *)uVar3,(char **)&local_50,10);
    if (local_50._M_dataplus._M_p != (pointer)uVar3) {
      iVar1 = *(int *)&(parameters->_M_dataplus)._M_p;
      if (iVar1 == 0) {
        *(int *)&(parameters->_M_dataplus)._M_p = iVar8;
      }
      else if (iVar1 == 0x22) {
        std::__throw_out_of_range("stoul");
        goto LAB_001a4baa;
      }
      (this->baud_rate_).value_ = (uint)uVar10;
      goto LAB_001a504b;
    }
    std::__throw_invalid_argument("stoul");
LAB_001a5184:
    std::__throw_invalid_argument("stoul");
LAB_001a5190:
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"unable to parse communication parameters: \"",parameters);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_98._0_8_ = *plVar11;
    psVar13 = (size_type *)(plVar11 + 2);
    if ((size_type *)local_98._0_8_ == psVar13) {
      local_98._16_8_ = *psVar13;
      local_98._24_8_ = plVar11[3];
      local_98._0_8_ = local_98 + 0x10;
    }
    else {
      local_98._16_8_ = *psVar13;
    }
    local_98._8_8_ = plVar11[1];
    *plVar11 = (long)psVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::invalid_argument::invalid_argument(this_00,(string *)local_98);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  _Var2._M_current = (parameters->_M_dataplus)._M_p;
  bVar4 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(_Var2._M_current + parameters->_M_string_length),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&local_78,
                     &parse_communication_parameters(std::__cxx11::string_const&)::
                      baud_rate_and_params_abi_cxx11_,0);
  if (bVar4) {
    lVar12 = local_78._8_8_ - local_78._0_8_;
    if ((lVar12 == 0) || (0xfffffffffffffffd < (lVar12 >> 3) * -0x5555555555555555 - 5U)) {
      puVar9 = (undefined8 *)(local_78._M_allocated_capacity + lVar12 + -0x48);
    }
    else {
      puVar9 = (undefined8 *)(local_78._M_allocated_capacity + 0x18);
    }
    if (*(char *)(puVar9 + 2) == '\x01') {
      local_98._0_8_ = local_98 + 0x10;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_98,*puVar9,puVar9[1]);
    }
    else {
      local_98._0_8_ = local_98 + 0x10;
      local_98._8_8_ = 0;
      local_98._16_8_ = local_98._16_8_ & 0xffffffffffffff00;
    }
    uVar3 = local_98._0_8_;
    parameters = (string *)__errno_location();
    iVar8 = *(int *)&(parameters->_M_dataplus)._M_p;
    *(int *)&(parameters->_M_dataplus)._M_p = 0;
    uVar10 = strtoul((char *)uVar3,(char **)&local_50,10);
    uVar5 = (uint)uVar10;
    if (local_50._M_dataplus._M_p == (pointer)uVar3) goto LAB_001a5184;
    iVar1 = *(int *)&(parameters->_M_dataplus)._M_p;
    if (iVar1 == 0) {
LAB_001a4cd0:
      *(int *)&(parameters->_M_dataplus)._M_p = iVar8;
    }
    else if (iVar1 == 0x22) {
      uVar5 = std::__throw_out_of_range("stoul");
      goto LAB_001a4cd0;
    }
    (this->baud_rate_).value_ = uVar5;
    psVar14 = (string *)(local_98 + 0x10);
    if ((string *)local_98._0_8_ != psVar14) {
      operator_delete((void *)local_98._0_8_);
    }
    lVar12 = local_78._8_8_ - local_78._0_8_;
    if ((lVar12 == 0) || (0xfffffffffffffffc < (lVar12 >> 3) * -0x5555555555555555 - 6U)) {
      puVar9 = (undefined8 *)(local_78._M_allocated_capacity + lVar12 + -0x48);
    }
    else {
      puVar9 = (undefined8 *)(local_78._M_allocated_capacity + 0x30);
    }
    if (*(char *)(puVar9 + 2) == '\x01') {
      local_98._0_8_ = local_98 + 0x10;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_98,*puVar9,puVar9[1]);
    }
    else {
LAB_001a4da3:
      local_98._8_8_ = 0;
      local_98._16_8_ = local_98._16_8_ & 0xffffffffffffff00;
      local_98._0_8_ = psVar14;
    }
    uVar3 = local_98._0_8_;
    iVar8 = *(int *)&(parameters->_M_dataplus)._M_p;
    *(int *)&(parameters->_M_dataplus)._M_p = 0;
    uVar10 = strtoul((char *)local_98._0_8_,(char **)&local_50,10);
    if (local_50._M_dataplus._M_p == (pointer)uVar3) {
LAB_001a51ef:
      std::__throw_invalid_argument("stoul");
LAB_001a51fb:
      std::out_of_range::out_of_range((out_of_range *)&local_50,"invalid character_size value");
      boost::throw_exception<std::out_of_range>((out_of_range *)&local_50);
    }
    iVar1 = *(int *)&(parameters->_M_dataplus)._M_p;
    if (iVar1 == 0) {
      *(int *)&(parameters->_M_dataplus)._M_p = iVar8;
    }
    else if (iVar1 == 0x22) {
      uVar5 = std::__throw_out_of_range("stoul");
LAB_001a4dfe:
      *(int *)&(parameters->_M_dataplus)._M_p = iVar8;
      goto LAB_001a4e01;
    }
    if ((uint)uVar10 - 9 < 0xfffffffc) {
      std::out_of_range::out_of_range((out_of_range *)&local_50,"invalid character_size value");
      boost::throw_exception<std::out_of_range>((out_of_range *)&local_50);
    }
    (this->character_size_).value_ = (uint)uVar10;
    psVar14 = (string *)(local_98 + 0x10);
    if ((string *)local_98._0_8_ != psVar14) {
      operator_delete((void *)local_98._0_8_);
    }
    lVar12 = local_78._8_8_ - local_78._0_8_;
    if ((lVar12 == 0) || (0xfffffffffffffffb < (lVar12 >> 3) * -0x5555555555555555 - 7U)) {
      puVar9 = (undefined8 *)(local_78._M_allocated_capacity + lVar12 + -0x48);
    }
    else {
      puVar9 = (undefined8 *)(local_78._M_allocated_capacity + 0x48);
    }
    if (*(char *)(puVar9 + 2) == '\x01') {
      local_98._0_8_ = local_98 + 0x10;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_98,*puVar9,puVar9[1]);
    }
    else {
      local_98._8_8_ = 0;
      local_98._16_8_ = local_98._16_8_ & 0xffffffffffffff00;
      local_98._0_8_ = psVar14;
    }
    pVar6 = parity_from_text((string *)local_98._0_8_);
    (this->parity_).value_ = pVar6.value_;
    if ((string *)local_98._0_8_ != psVar14) {
      operator_delete((void *)local_98._0_8_);
    }
    lVar12 = local_78._8_8_ - local_78._0_8_;
    if ((lVar12 == 0) || (0xfffffffffffffffa < (lVar12 >> 3) * -0x5555555555555555 - 8U)) {
      puVar9 = (undefined8 *)(local_78._M_allocated_capacity + lVar12 + -0x48);
    }
    else {
      puVar9 = (undefined8 *)(local_78._M_allocated_capacity + 0x60);
    }
    if (*(char *)(puVar9 + 2) == '\x01') {
      local_98._0_8_ = local_98 + 0x10;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_98,*puVar9,puVar9[1]);
    }
    else {
LAB_001a5021:
      local_98._0_8_ = local_98 + 0x10;
      local_98._8_8_ = 0;
      local_98._16_8_ = local_98._16_8_ & 0xffffffffffffff00;
    }
  }
  else {
LAB_001a4baa:
    _Var2._M_current = (parameters->_M_dataplus)._M_p;
    bVar4 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                      (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(_Var2._M_current + parameters->_M_string_length),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&local_78,
                       &parse_communication_parameters(std::__cxx11::string_const&)::
                        params_only_abi_cxx11_,0);
    if (!bVar4) goto LAB_001a5190;
    unaff_R13 = -0x5555555555555555;
    lVar12 = local_78._8_8_ - local_78._0_8_;
    if ((lVar12 == 0) || (0xfffffffffffffffd < (lVar12 >> 3) * -0x5555555555555555 - 5U)) {
      puVar9 = (undefined8 *)(local_78._M_allocated_capacity + lVar12 + -0x48);
    }
    else {
      puVar9 = (undefined8 *)(local_78._M_allocated_capacity + 0x18);
    }
    if (*(char *)(puVar9 + 2) == '\x01') {
      local_98._0_8_ = local_98 + 0x10;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_98,*puVar9,puVar9[1]);
    }
    else {
      local_98._0_8_ = local_98 + 0x10;
      local_98._8_8_ = 0;
      local_98._16_8_ = local_98._16_8_ & 0xffffffffffffff00;
    }
    psVar14 = (string *)local_98._0_8_;
    parameters = (string *)__errno_location();
    iVar8 = *(int *)&(parameters->_M_dataplus)._M_p;
    *(int *)&(parameters->_M_dataplus)._M_p = 0;
    uVar10 = strtoul((char *)psVar14,(char **)&local_50,10);
    uVar5 = (uint)uVar10;
    if ((string *)local_50._M_dataplus._M_p == psVar14) {
      std::__throw_invalid_argument("stoul");
      goto LAB_001a51ef;
    }
    iVar1 = *(int *)&(parameters->_M_dataplus)._M_p;
    if (iVar1 == 0) goto LAB_001a4dfe;
    if (iVar1 == 0x22) {
      std::__throw_out_of_range("stoul");
      goto LAB_001a4da3;
    }
LAB_001a4e01:
    if (uVar5 - 9 < 0xfffffffc) goto LAB_001a51fb;
    (this->character_size_).value_ = uVar5;
    psVar14 = (string *)(local_98 + 0x10);
    if ((string *)local_98._0_8_ != psVar14) {
      operator_delete((void *)local_98._0_8_);
    }
    lVar12 = local_78._8_8_ - local_78._0_8_;
    if ((lVar12 == 0) || (0xfffffffffffffffc < (lVar12 >> 3) * unaff_R13 - 6U)) {
      puVar9 = (undefined8 *)(local_78._M_allocated_capacity + lVar12 + -0x48);
    }
    else {
      puVar9 = (undefined8 *)(local_78._M_allocated_capacity + 0x30);
    }
    if (*(char *)(puVar9 + 2) == '\x01') {
      local_98._0_8_ = local_98 + 0x10;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_98,*puVar9,puVar9[1]);
    }
    else {
      local_98._8_8_ = 0;
      local_98._16_8_ = local_98._16_8_ & 0xffffffffffffff00;
      local_98._0_8_ = psVar14;
    }
    pVar6 = parity_from_text((string *)local_98._0_8_);
    (this->parity_).value_ = pVar6.value_;
    if ((string *)local_98._0_8_ != psVar14) {
      operator_delete((void *)local_98._0_8_);
    }
    lVar12 = local_78._8_8_ - local_78._0_8_;
    if ((lVar12 == 0) || (0xfffffffffffffffb < (lVar12 >> 3) * unaff_R13 - 7U)) {
      puVar9 = (undefined8 *)(local_78._M_allocated_capacity + lVar12 + -0x48);
    }
    else {
      puVar9 = (undefined8 *)(local_78._M_allocated_capacity + 0x48);
    }
    if (*(char *)(puVar9 + 2) != '\x01') goto LAB_001a5021;
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)local_98,*puVar9,puVar9[1]);
  }
  sVar7 = stop_bits_from_text((string *)local_98);
  (this->stop_bits_).value_ = sVar7.value_;
LAB_001a504b:
  if ((string *)local_98._0_8_ != (string *)(local_98 + 0x10)) {
    operator_delete((void *)local_98._0_8_);
  }
  if ((void *)local_78._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_78._M_allocated_capacity);
  }
  return;
}

Assistant:

void interface::parse_communication_parameters( const std::string& parameters )
{
    static const std::regex baud_rate( "^(\\d+)" );
    static const std::regex baud_rate_and_params( "^(\\d+)\\,([78])([noeNOE])(1\\.5|1|2)" );
    static const std::regex params_only( "([78])([noeNOE])(1\\.5|1|2))" );

    std::smatch match;
    if ( std::regex_match( parameters, match, baud_rate ) )
    {
        baud_rate_ = boost::asio::serial_port_base::baud_rate( stoul( match[ 1 ] ) );
    }
    else if ( std::regex_match( parameters, match, baud_rate_and_params ) )
    {
        baud_rate_      = boost::asio::serial_port_base::baud_rate( stoul( match[ 1 ] ) );
        character_size_ = boost::asio::serial_port_base::character_size( stoul( match[ 2 ] ) );
        parity_         = parity_from_text( match[ 3 ] );
        stop_bits_      = stop_bits_from_text( match[ 4 ] );
    }
    else if ( std::regex_match( parameters, match, params_only ) )
    {
        character_size_ = boost::asio::serial_port_base::character_size( stoul( match[ 1 ] ) );
        parity_         = parity_from_text( match[ 2 ] );
        stop_bits_      = stop_bits_from_text( match[ 3 ] );
    }
    else
    {
        throw std::invalid_argument( "unable to parse communication parameters: \"" + parameters + "\"" );
    }
}